

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O2

void __thiscall HMISong::AdvanceTracks(HMISong *this,DWORD time)

{
  int iVar1;
  DWORD *pDVar2;
  long lVar3;
  
  iVar1 = this->NumTracks;
  pDVar2 = &this->Tracks->Delay;
  for (lVar3 = 0; lVar3 <= iVar1; lVar3 = lVar3 + 1) {
    if ((*(bool *)(pDVar2 + 6) == true) && (*(bool *)((long)pDVar2 + 0x19) == false)) {
      *pDVar2 = *pDVar2 - time;
      pDVar2[1] = pDVar2[1] + time;
    }
    pDVar2 = pDVar2 + 0xe;
  }
  NoteOffQueue::AdvanceTime(&this->NoteOffs,time);
  return;
}

Assistant:

void HMISong::AdvanceTracks(DWORD time)
{
	for (int i = 0; i <= NumTracks; ++i)
	{
		if (Tracks[i].Enabled && !Tracks[i].Finished)
		{
			Tracks[i].Delay -= time;
			Tracks[i].PlayedTime += time;
		}
	}
	NoteOffs.AdvanceTime(time);
}